

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O1

int __thiscall
duckdb_re2::Regexp::Walker<int>::WalkInternal
          (Walker<int> *this,Regexp *re,int top_arg,bool use_copy)

{
  stack<duckdb_re2::WalkState<int>,_std::deque<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>_>
  *this_00;
  iterator *piVar1;
  ushort uVar2;
  uint uVar3;
  Regexp *pRVar4;
  _Elt_pointer pWVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  _Elt_pointer pWVar10;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar11;
  int unaff_R13D;
  bool stop;
  int local_1bc;
  undefined1 local_1b0 [8];
  int iStack_1a8;
  int iStack_1a4;
  int local_1a0;
  int iStack_19c;
  int *piStack_198;
  ios_base local_138 [264];
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&iStack_1a8,"Walk NULL",9);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    this_00 = &this->stack_;
    iStack_1a8 = -1;
    piStack_198 = (int *)0x0;
    pWVar10 = (this->stack_).c.
              super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_1b0 = (undefined1  [8])re;
    iStack_1a4 = top_arg;
    if (pWVar10 ==
        (this->stack_).c.
        super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>>::
      _M_push_back_aux<duckdb_re2::WalkState<int>>
                ((deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>> *)
                 this_00,(WalkState<int> *)local_1b0);
    }
    else {
      pWVar10->pre_arg = local_1a0;
      pWVar10->child_arg = iStack_19c;
      pWVar10->child_args = (int *)0x0;
      pWVar10->re = re;
      pWVar10->n = 0xffffffff;
      pWVar10->parent_arg = top_arg;
      piVar1 = &(this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    do {
      pWVar10 = (this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar10 ==
          (this->stack_).c.
          super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar10 = (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pRVar4 = pWVar10[-1].re;
      iVar8 = unaff_R13D;
      if (pWVar10[-1].n == -1) {
        iVar8 = this->max_visits_;
        this->max_visits_ = iVar8 + -1;
        if (iVar8 < 1) {
          this->stopped_early_ = true;
          iVar8 = (*this->_vptr_Walker[5])(this,pRVar4,(ulong)(uint)pWVar10[-1].parent_arg);
        }
        else {
          local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
          iVar8 = (*this->_vptr_Walker[2])
                            (this,pRVar4,(ulong)(uint)pWVar10[-1].parent_arg,local_1b0);
          pWVar10[-1].pre_arg = iVar8;
          cVar6 = local_1b0[0];
          if (local_1b0[0] == '\0') {
            pWVar10[-1].n = 0;
            pWVar10[-1].child_args = (int *)0x0;
            uVar2 = pRVar4->nsub_;
            iVar8 = unaff_R13D;
            if (uVar2 != 0) {
              if (uVar2 == 1) {
                piVar9 = &pWVar10[-1].child_arg;
              }
              else {
                piVar9 = (int *)operator_new__((ulong)uVar2 << 2);
              }
              pWVar10[-1].child_args = piVar9;
            }
          }
          if (cVar6 == '\0') goto LAB_00484107;
        }
LAB_004842b5:
        std::deque<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>::
        pop_back(&this_00->c);
        pWVar10 = (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pWVar10 ==
            (this->stack_).c.
            super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          iVar7 = 1;
          local_1bc = iVar8;
        }
        else {
          if (pWVar10 ==
              (this->stack_).c.
              super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pWVar10 = (this->stack_).c.
                      super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          if (pWVar10[-1].child_args == (int *)0x0) {
            piVar9 = &pWVar10[-1].child_arg;
          }
          else {
            piVar9 = pWVar10[-1].child_args + pWVar10[-1].n;
          }
          *piVar9 = iVar8;
          pWVar10[-1].n = pWVar10[-1].n + 1;
          iVar7 = 0;
        }
      }
      else {
LAB_00484107:
        uVar2 = pRVar4->nsub_;
        if (uVar2 == 0) {
LAB_00484265:
          iVar8 = (*this->_vptr_Walker[3])
                            (this,pRVar4,(ulong)(uint)pWVar10[-1].parent_arg,
                             (ulong)(uint)pWVar10[-1].pre_arg,pWVar10[-1].child_args,
                             (ulong)(uint)pWVar10[-1].n);
          if ((1 < pRVar4->nsub_) && (pWVar10[-1].child_args != (int *)0x0)) {
            operator_delete__(pWVar10[-1].child_args);
          }
          goto LAB_004842b5;
        }
        if (uVar2 == 1) {
          paVar11 = &pRVar4->field_5;
        }
        else {
          paVar11 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar4->field_5).submany_;
        }
        uVar3 = pWVar10[-1].n;
        iVar7 = 0;
        if ((int)uVar3 < (int)(uint)uVar2) {
          if (((int)uVar3 < 1 || !use_copy) ||
             ((Regexp *)paVar11[uVar3 - 1].submany_ != (Regexp *)paVar11[uVar3].submany_)) {
            local_1b0 = (undefined1  [8])paVar11[pWVar10[-1].n].submany_;
            iStack_1a4 = pWVar10[-1].pre_arg;
            iStack_1a8 = -1;
            piStack_198 = (int *)0x0;
            pWVar5 = (this->stack_).c.
                     super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (pWVar5 == (this->stack_).c.
                          super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>>::
              _M_push_back_aux<duckdb_re2::WalkState<int>>
                        ((deque<duckdb_re2::WalkState<int>,std::allocator<duckdb_re2::WalkState<int>>>
                          *)this_00,(WalkState<int> *)local_1b0);
            }
            else {
              pWVar5->pre_arg = local_1a0;
              pWVar5->child_arg = iStack_19c;
              pWVar5->child_args = (int *)0x0;
              pWVar5->re = (Regexp *)local_1b0;
              pWVar5->n = 0xffffffff;
              pWVar5->parent_arg = iStack_1a4;
              piVar1 = &(this->stack_).c.
                        super__Deque_base<duckdb_re2::WalkState<int>,_std::allocator<duckdb_re2::WalkState<int>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
          }
          else {
            iVar7 = (*this->_vptr_Walker[4])(this,(ulong)(uint)pWVar10[-1].child_args[uVar3 - 1]);
            pWVar10[-1].child_args[pWVar10[-1].n] = iVar7;
            pWVar10[-1].n = pWVar10[-1].n + 1;
          }
          iVar7 = 3;
        }
        if ((int)(uint)uVar2 <= (int)uVar3) goto LAB_00484265;
      }
      unaff_R13D = iVar8;
    } while ((iVar7 == 0) || (top_arg = local_1bc, iVar7 == 3));
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}